

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O0

void __thiscall CppUnit::PlugInManager::unload(PlugInManager *this,string *libraryFileName)

{
  bool bVar1;
  __type _Var2;
  reference pPVar3;
  iterator local_98;
  const_iterator local_78;
  iterator local_58;
  undefined1 local_38 [8];
  iterator it;
  string *libraryFileName_local;
  PlugInManager *this_local;
  
  it._M_node = (_Map_pointer)libraryFileName;
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  begin((iterator *)local_38,&this->m_plugIns);
  while( true ) {
    std::
    deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
    end(&local_58,&this->m_plugIns);
    bVar1 = std::operator!=((_Self *)local_38,&local_58);
    if (!bVar1) {
      return;
    }
    pPVar3 = std::
             _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
             ::operator*((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                          *)local_38);
    _Var2 = std::operator==(&pPVar3->m_fileName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            it._M_node);
    if (_Var2) break;
    std::
    _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
    ::operator++((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                  *)local_38);
  }
  pPVar3 = std::
           _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
           ::operator*((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                        *)local_38);
  unload(this,pPVar3);
  std::
  _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,CppUnit::PlugInManager::PlugInInfo_const&,CppUnit::PlugInManager::PlugInInfo_const*>
  ::
  _Deque_iterator<std::_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,CppUnit::PlugInManager::PlugInInfo&,CppUnit::PlugInManager::PlugInInfo*>,void>
            ((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,CppUnit::PlugInManager::PlugInInfo_const&,CppUnit::PlugInManager::PlugInInfo_const*>
              *)&local_78,
             (_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
              *)local_38);
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  erase(&local_98,&this->m_plugIns,&local_78);
  return;
}

Assistant:

void 
PlugInManager::unload( const std::string &libraryFileName )
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
  {
    if ( (*it).m_fileName == libraryFileName )
    {
      unload( *it );
      m_plugIns.erase( it );
      break;
    }
  }
}